

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoel.cpp
# Opt level: O2

bool __thiscall TPZGeoEl::VerifyNodeCoordinates(TPZGeoEl *this,REAL tol)

{
  int iVar1;
  int iVar2;
  int i;
  TPZGeoNode *this_00;
  ostream *poVar3;
  int dim_1;
  int dim;
  long lVar4;
  REAL RVar5;
  double dVar6;
  string local_280 [32];
  TPZManVector<double,_3> NodeX;
  TPZManVector<double,_3> MappedX;
  TPZManVector<double,_3> qsi;
  stringstream mess;
  ostream local_1a8 [376];
  
  iVar1 = (**(code **)(*(long *)this + 0x98))();
  iVar2 = (**(code **)(*(long *)this + 0x210))(this);
  TPZManVector<double,_3>::TPZManVector(&qsi,(long)iVar2);
  TPZManVector<double,_3>::TPZManVector(&MappedX,3);
  TPZManVector<double,_3>::TPZManVector(&NodeX,3);
  i = 0;
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  do {
    if (i == iVar2) {
      TPZManVector<double,_3>::~TPZManVector(&NodeX);
      TPZManVector<double,_3>::~TPZManVector(&MappedX);
      TPZManVector<double,_3>::~TPZManVector(&qsi);
      return iVar1 <= i;
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      this_00 = NodePtr(this,i);
      RVar5 = TPZGeoNode::Coord(this_00,(int)lVar4);
      NodeX.super_TPZVec<double>.fStore[lVar4] = RVar5;
    }
    (**(code **)(*(long *)this + 0x260))(this,i,&qsi);
    (**(code **)(*(long *)this + 0x228))(this,&qsi,&MappedX);
    dVar6 = 0.0;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      dVar6 = dVar6 + (NodeX.super_TPZVec<double>.fStore[lVar4] -
                      MappedX.super_TPZVec<double>.fStore[lVar4]) *
                      (NodeX.super_TPZVec<double>.fStore[lVar4] -
                      MappedX.super_TPZVec<double>.fStore[lVar4]);
    }
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
  } while ((dVar6 <= tol) && (i = i + 1, !NAN(dVar6)));
  std::__cxx11::stringstream::stringstream((stringstream *)&mess);
  poVar3 = std::operator<<(local_1a8,"FATAL ERROR AT ");
  poVar3 = std::operator<<(poVar3,"bool TPZGeoEl::VerifyNodeCoordinates(REAL)");
  std::operator<<(poVar3," - Node coordinate differs from mapped node.\n");
  (**(code **)(*(long *)this + 0x1a0))(this,local_1a8);
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<((ostream *)&std::cerr,local_280);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_280);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoel.cpp",
             0x6d2);
}

Assistant:

bool TPZGeoEl::VerifyNodeCoordinates(REAL tol){
	const int nnodes = this->NCornerNodes();
	TPZManVector<REAL,3> qsi(this->Dimension());
	TPZManVector<REAL,3> MappedX(3), NodeX(3);
	for(int inode = 0; inode < nnodes; inode++){
		for(int dim = 0; dim < 3; dim++){
			NodeX[dim] = this->NodePtr(inode)->Coord(dim);
		}//dim
		this->CenterPoint(inode,qsi);
		this->X(qsi,MappedX);
		REAL error = 0.;
		for(int dim = 0; dim < 3; dim++){
			error += (NodeX[dim]-MappedX[dim])*(NodeX[dim]-MappedX[dim]);
		}//dim
		error = sqrt(error);
		if(error > tol || !(error==error)){
			std::stringstream mess;
			mess << "FATAL ERROR AT " << __PRETTY_FUNCTION__ << " - Node coordinate differs from mapped node.\n";
			this->Print(mess);
			PZError << mess.str() << "\n";
#ifdef PZ_LOG
			LOGPZ_ERROR(logger,mess.str().c_str());
#endif
			DebugStop();
			return false;
		}
	}//for i
	return true;
}